

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

Node * __thiscall Graph::getNode(Graph *this,int idx)

{
  Node *pNVar1;
  ostream *poVar2;
  pointer ppNVar3;
  
  ppNVar3 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppNVar3 ==
        (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Node ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,idx);
      std::operator<<(poVar2,"does not exist\n");
      return (Node *)0x0;
    }
    pNVar1 = *ppNVar3;
    ppNVar3 = ppNVar3 + 1;
  } while (pNVar1->index != idx);
  return pNVar1;
}

Assistant:

Node* Graph::getNode(int idx) {
    // TODO: Look for a way to sort by index to compute faster this operation
    for(auto&node:adj_list)
        if(node->index == idx)
            return node;
    std::cerr<<"Node "<< idx << "does not exist\n";
    return nullptr;
}